

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>
::visit_bool(basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>
             *this,bool value,semantic_tag param_3,ser_context *param_4,error_code *param_5)

{
  bool bVar1;
  reference pvVar2;
  size_t sVar3;
  array<wchar_t,_4UL> *this_00;
  array<wchar_t,_5UL> *this_01;
  byte in_SIL;
  wchar_t *in_RDI;
  stream_sink<wchar_t> *in_R8;
  vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
  *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  wchar_t ch;
  stream_sink<wchar_t> *in_stack_ffffffffffffffd0;
  
  ch = (wchar_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  bVar1 = std::
          vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
          ::empty((vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
                   *)in_stack_ffffffffffffffd0);
  if (!bVar1) {
    pvVar2 = std::
             vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
             ::back(in_stack_ffffffffffffffc0);
    bVar1 = encoding_context::is_array(pvVar2);
    if (bVar1) {
      pvVar2 = std::
               vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
               ::back(in_stack_ffffffffffffffc0);
      sVar3 = encoding_context::count(pvVar2);
      if (sVar3 != 0) {
        stream_sink<wchar_t>::push_back(in_stack_ffffffffffffffd0,ch);
      }
    }
  }
  if ((in_SIL & 1) == 0) {
    false_constant();
    in_stack_ffffffffffffffc0 =
         (vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
          *)std::array<wchar_t,_5UL>::data((array<wchar_t,_5UL> *)0x9de040);
    this_01 = false_constant();
    std::array<wchar_t,_5UL>::size(this_01);
    stream_sink<wchar_t>::append(in_R8,in_RDI,(size_t)in_stack_ffffffffffffffd0);
  }
  else {
    true_constant();
    in_stack_ffffffffffffffd0 =
         (stream_sink<wchar_t> *)std::array<wchar_t,_4UL>::data((array<wchar_t,_4UL> *)0x9de000);
    this_00 = true_constant();
    std::array<wchar_t,_4UL>::size(this_00);
    stream_sink<wchar_t>::append(in_R8,in_RDI,(size_t)in_stack_ffffffffffffffd0);
  }
  bVar1 = std::
          vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
          ::empty((vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
                   *)in_stack_ffffffffffffffd0);
  if (!bVar1) {
    pvVar2 = std::
             vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
             ::back(in_stack_ffffffffffffffc0);
    encoding_context::increment_count(pvVar2);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_bool(bool value, semantic_tag, const ser_context&, std::error_code&) final
        {
            if (!stack_.empty() && stack_.back().is_array() && stack_.back().count() > 0)
            {
                sink_.push_back(',');
            }

            if (value)
            {
                sink_.append(true_constant().data(), true_constant().size());
            }
            else
            {
                sink_.append(false_constant().data(), false_constant().size());
            }

            if (!stack_.empty())
            {
                stack_.back().increment_count();
            }
            JSONCONS_VISITOR_RETURN;
        }